

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Float __thiscall pbrt::WrinkledTexture::Evaluate(WrinkledTexture *this,TextureEvalContext ctx)

{
  Vector3f dpdy;
  Vector3f dpdx;
  Float FVar1;
  Point3f p;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  Tuple3<pbrt::Point3,_float> *local_70;
  undefined8 **local_68;
  undefined8 **local_60;
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [3];
  int iStack_1c;
  
  local_98 = &local_80;
  local_a0 = &local_90;
  local_70 = local_58;
  local_68 = &local_98;
  local_60 = &local_a0;
  local_80 = 0;
  local_90 = 0;
  local_78 = 0.0;
  local_88 = 0.0;
  local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_40[1].z = ctx.dudx;
  aTStack_40[2].x = ctx.dudy;
  aTStack_40[2].y = ctx.dvdx;
  aTStack_40[2].z = ctx.dvdy;
  iStack_1c = ctx.faceIndex;
  p = const::{lambda(auto:1)#1}::operator()
                ((_lambda_auto_1__1_ *)&local_70,
                 (TransformMapping3D *)
                 ((this->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits &
                 0xffffffffffff));
  dpdx.super_Tuple3<pbrt::Vector3,_float>.z = local_78;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_80;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_80._4_4_;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.z = local_88;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_90;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_90._4_4_;
  FVar1 = Turbulence(p,dpdx,dpdy,this->omega,this->octaves);
  return FVar1;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Vector3f dpdx, dpdy;
        Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
        return Turbulence(p, dpdx, dpdy, omega, octaves);
    }